

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::add_val(CVmObjVector *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  CVmObjPageEntry *this_00;
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  uint uVar8;
  int iVar9;
  int idx;
  size_t idx_00;
  uint16_t tmp;
  vm_val_t ele;
  
  pvVar5 = sp_;
  uVar4 = *(undefined4 *)&val->field_0x4;
  aVar3 = val->val;
  sp_ = sp_ + 1;
  pvVar5->typ = val->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar3;
  uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  idx_00 = (size_t)uVar1;
  iVar6 = vm_val_t::is_listlike(val);
  if (iVar6 == 0) {
    iVar6 = -1;
  }
  else {
    iVar6 = vm_val_t::ll_length(val);
  }
  idx = 1;
  iVar9 = iVar6;
  if (iVar6 < 0) {
    iVar9 = 1;
  }
  vVar7 = create(0,(ulong)(iVar9 + (uint)uVar1));
  result->typ = VM_OBJ;
  (result->val).obj = vVar7;
  pvVar5 = sp_;
  pCVar2 = G_obj_table_X.pages_[vVar7 >> 0xc];
  uVar8 = vVar7 & 0xfff;
  this_00 = pCVar2 + uVar8;
  uVar4 = *(undefined4 *)&result->field_0x4;
  aVar3 = result->val;
  sp_ = sp_ + 1;
  pvVar5->typ = result->typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar4;
  pvVar5->val = aVar3;
  memcpy((void *)(*(long *)((long)&pCVar2[uVar8].ptr_ + 8) + 4),
         (this->super_CVmObjCollection).super_CVmObject.ext_ + 4,idx_00 * 5);
  *(ushort *)(*(long *)((long)&pCVar2[uVar8].ptr_ + 8) + 2) = uVar1;
  if (iVar6 < 0) {
    set_element((CVmObjVector *)this_00,idx_00,val);
    *(ushort *)(*(char **)((long)&this_00->ptr_ + 8) + 2) = uVar1 + 1;
  }
  else {
    for (; idx - iVar6 != 1; idx = idx + 1) {
      vm_val_t::ll_index(val,&ele,idx);
      set_element((CVmObjVector *)this_00,idx_00,&ele);
      idx_00 = idx_00 + 1;
      *(short *)(*(char **)((long)&this_00->ptr_ + 8) + 2) = (short)idx_00;
    }
  }
  sp_ = sp_ + -2;
  return 1;
}

Assistant:

int CVmObjVector::add_val(VMG_ vm_val_t *result,
                          vm_obj_id_t self, const vm_val_t *val)
{
    int idx;
    int rhs_cnt, alo_cnt;
    int i;
    CVmObjVector *new_vec;

    /* push the value to append, for gc protection */
    G_stk->push(val);

    /* 
     *   remember the index of the first new element - this is simply one
     *   higher than the last valid current index 
     */
    idx = get_element_count();

    /* get the number of elements to add */
    rhs_cnt = (val->is_listlike(vmg0_) ? val->ll_length(vmg0_) : -1);

    /* if it's not list-like, just add it directly as a single element */
    alo_cnt = (rhs_cnt < 0 ? 1 : rhs_cnt);

    /* 
     *   allocate a copy of the vector for the result - make it big enough
     *   for my elements plus the elements to be appended 
     */
    result->set_obj(create(vmg_ FALSE, idx + alo_cnt));

    /* get the return value as a vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ result->val.obj);

    /* push the result for gc protection */
    G_stk->push(result);

    /* copy my elements into the result */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(idx));

    /* 
     *   set the element count to include the elements copied so far (it's a
     *   new vector, so there's no need to save undo) 
     */
    new_vec->set_element_count(idx);

    /* add the new element or elements */
    if (rhs_cnt < 0)
    {
        /* add a single element */
        new_vec->set_element(idx, val);
        new_vec->set_element_count(idx + 1);
    }
    else
    {
        /* add the contents of the rhs */
        for (i = 1 ; i <= rhs_cnt ; ++i, ++idx)
        {
            /* get this element from the right-hand side */
            vm_val_t ele;
            val->ll_index(vmg_ &ele, i);
            
            /* store the element in the result */
            new_vec->set_element(idx, &ele);
            new_vec->set_element_count(idx + 1);
        }
    }

    /* discard the gc protect */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}